

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

ON__LayerExtensions *
ON__LayerExtensions::LayerExtensions(ON_Layer *layer,uchar *layer_m_extension_bits,bool bCreate)

{
  bool bVar1;
  byte bVar2;
  ON__LayerExtensions *this;
  ON_UUID local_30;
  
  local_30 = ON_ClassId::Uuid(&m_ON__LayerExtensions_class_rtti);
  this = (ON__LayerExtensions *)ON_Object::GetUserData((ON_Object *)layer,&local_30);
  if (this == (ON__LayerExtensions *)0x0) {
LAB_004bfd91:
    if (!bCreate) {
      bVar2 = *layer_m_extension_bits | 1;
      this = (ON__LayerExtensions *)0x0;
      goto LAB_004bfdc3;
    }
    this = (ON__LayerExtensions *)operator_new(0xe0);
    ON__LayerExtensions(this);
    ON_Object::AttachUserData((ON_Object *)layer,(ON_UserData *)this);
  }
  else {
    bVar1 = ON_Object::IsKindOf((ON_Object *)this,&m_ON__LayerExtensions_class_rtti);
    if (!bVar1) goto LAB_004bfd91;
  }
  bVar2 = *layer_m_extension_bits & 0xfe;
LAB_004bfdc3:
  *layer_m_extension_bits = bVar2;
  return this;
}

Assistant:

ON__LayerExtensions* ON__LayerExtensions::LayerExtensions(const ON_Layer& layer, const unsigned char* layer_m_extension_bits, bool bCreate)
{
  ON__LayerExtensions* ud = ON__LayerExtensions::Cast(layer.GetUserData(ON_CLASS_ID(ON__LayerExtensions)));

  if ( 0 == ud )
  {
    if ( bCreate )
    {
      ud = new ON__LayerExtensions();
      const_cast<ON_Layer&>(layer).AttachUserData(ud);
      // Clear 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will check
      // for ON__LayerExtensions userdata.
      ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
    else
    {
      // Set 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will not
      // perform the expensive check for ON__LayerExtensions 
      // userdata. This speeds up visibility and color queries 
      // that occur millions of times when complicated models
      // are rendered.
      SetExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
  }
  else
  {
    // Clear 0x01 bit of ON_Layer::m_extension_bits so 
    // ON_Layer visibility and color queries will check
    // for ON__LayerExtensions userdata.
    ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
  }

  return ud;
}